

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

ostream * masc::polygon::operator<<(ostream *os,c_ply *p)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  double *pdVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar4;
  int local_24;
  ply_vertex *ppStack_20;
  int i;
  ply_vertex *ptr;
  c_ply *p_local;
  ostream *os_local;
  
  iVar1 = c_ply::getSize(p);
  poVar2 = (ostream *)std::ostream::operator<<(os,iVar1);
  poVar2 = std::operator<<(poVar2," ");
  pcVar4 = "out";
  if (p->type == PIN) {
    pcVar4 = "in";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::operator<<(poVar2,"\n");
  ppStack_20 = p->head;
  do {
    iVar1 = (*ppStack_20->_vptr_ply_vertex[2])();
    pdVar3 = mathtool::Point<double,_2>::operator[]
                       ((Point<double,_2> *)CONCAT44(extraout_var,iVar1),0);
    poVar2 = (ostream *)std::ostream::operator<<(os,*pdVar3);
    poVar2 = std::operator<<(poVar2," ");
    iVar1 = (*ppStack_20->_vptr_ply_vertex[2])();
    pdVar3 = mathtool::Point<double,_2>::operator[]
                       ((Point<double,_2> *)CONCAT44(extraout_var_00,iVar1),1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
    std::operator<<(poVar2,"\n");
    iVar1 = (*ppStack_20->_vptr_ply_vertex[3])();
    ppStack_20 = (ply_vertex *)CONCAT44(extraout_var_01,iVar1);
  } while (ppStack_20 != p->head);
  local_24 = 0;
  while( true ) {
    iVar1 = c_ply::getSize(p);
    if (iVar1 <= local_24) break;
    poVar2 = (ostream *)std::ostream::operator<<(os,local_24 + 1);
    std::operator<<(poVar2," ");
    local_24 = local_24 + 1;
  }
  std::operator<<(os,"\n");
  return os;
}

Assistant:

ostream& operator<<( ostream& os, c_ply& p)
{
    os<<p.getSize()<<" "<<((p.type==c_ply::PIN)?"in":"out")<<"\n";
    ply_vertex * ptr=p.head;
    do{
        os<<ptr->getPos()[0]<<" "<<ptr->getPos()[1]<<"\n";
        ptr=ptr->getNext();
    }while(ptr!=p.head);

    for(int i=0;i<p.getSize();i++) os<<i+1<<" ";
    os<<"\n";
    return os;
}